

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ordered_set.h
# Opt level: O0

void __thiscall xla::OrderedSet<int>::Erase(OrderedSet<int> *this,int value)

{
  int iVar1;
  bool bVar2;
  ostream *this_00;
  pointer ppVar3;
  reference pvVar4;
  mapped_type *pmVar5;
  reference __b;
  _Node_iterator_base<std::pair<const_int,_int>,_false> _Stack_28;
  int index;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_20;
  iterator it;
  int value_local;
  OrderedSet<int> *this_local;
  
  it.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur._4_4_ = value;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
       ::find(&this->value_to_index_,
              (key_type *)
              ((long)&it.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur + 4));
  _Stack_28._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
       ::end(&this->value_to_index_);
  bVar2 = std::__detail::operator==(&local_20,&stack0xffffffffffffffd8);
  if (!bVar2) {
    ppVar3 = std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>::operator->
                       ((_Node_iterator<std::pair<const_int,_int>,_false,_false> *)&local_20);
    iVar1 = ppVar3->second;
    pvVar4 = std::vector<int,_std::allocator<int>_>::back(&this->value_sequence_);
    pmVar5 = std::
             unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::operator[](&this->value_to_index_,pvVar4);
    *pmVar5 = iVar1;
    ppVar3 = std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>::operator->
                       ((_Node_iterator<std::pair<const_int,_int>,_false,_false> *)&local_20);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->value_sequence_,(long)ppVar3->second);
    __b = std::vector<int,_std::allocator<int>_>::back(&this->value_sequence_);
    std::swap<int>(pvVar4,__b);
    std::vector<int,_std::allocator<int>_>::pop_back(&this->value_sequence_);
    std::
    unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::erase(&this->value_to_index_,(iterator)local_20._M_cur);
    return;
  }
  this_00 = std::operator<<((ostream *)&std::cerr,"Value not found in OrderedSet");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  exit(0);
}

Assistant:

void Erase(T value) {
    auto it = value_to_index_.find(value);
    if (it == value_to_index_.end()) {
      std::cerr << "Value not found in OrderedSet" << std::endl;
      exit(0);
    }

    auto index = it->second;
    // Since we don't want to move values around in `value_sequence_` we swap
    // the value in the last position and with value to be deleted and then
    // pop_back.
    value_to_index_[value_sequence_.back()] = index;
    std::swap(value_sequence_[it->second], value_sequence_.back());
    value_sequence_.pop_back();
    value_to_index_.erase(it);
  }